

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

int stb_ps_enum(stb_ps *ps,void *data,_func_int_void_ptr_void_ptr *func)

{
  int iVar1;
  int iVar2;
  long lVar3;
  
  switch((uint)ps & 3) {
  case 0:
    if (ps != (stb_ps *)0x0) {
      iVar1 = (*func)(ps,data);
      return iVar1;
    }
    iVar1 = 1;
    break;
  case 1:
    iVar1 = 1;
    for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
      if ((*(void **)(ps + lVar3 * 8 + -1) != (void *)0x0) &&
         (iVar2 = (*func)(*(void **)(ps + lVar3 * 8 + -1),data), iVar2 == 0)) goto LAB_001531d4;
    }
    break;
  case 2:
    lVar3 = 0;
    do {
      if (*(int *)(ps + -2) <= lVar3) {
        return 1;
      }
      iVar1 = (*func)(*(void **)(ps + lVar3 * 8 + 6),data);
      lVar3 = lVar3 + 1;
    } while (iVar1 != 0);
LAB_001531d4:
    iVar1 = 0;
    break;
  case 3:
    iVar1 = 1;
    for (lVar3 = 0; lVar3 < *(int *)(ps + 5); lVar3 = lVar3 + 1) {
      if ((((ulong)*(void **)(ps + lVar3 * 8 + 0x1d) & 0xfffffffe) != 0) &&
         (iVar2 = (*func)(*(void **)(ps + lVar3 * 8 + 0x1d),data), iVar2 == 0)) goto LAB_001531d4;
    }
  }
  return iVar1;
}

Assistant:

int stb_ps_enum(stb_ps *ps, void *data, int (*func)(void *value, void *data))
{
   int i;
   switch (3 & (int) ps) {
      case STB_ps_direct:
         if (ps == NULL) return STB_TRUE;
         return func(ps, data);
      case STB_ps_bucket: {
         stb_ps_bucket *b = GetBucket(ps);
         for (i=0; i < STB_BUCKET_SIZE; ++i)
            if (b->p[i] != NULL)
               if (!func(b->p[i], data))
                  return STB_FALSE;
         return STB_TRUE;
      }
      case STB_ps_array: {
         stb_ps_array *a = GetArray(ps);
         for (i=0; i < a->count; ++i)
            if (!func(a->p[i], data))
               return STB_FALSE;
         return STB_TRUE;
      }
      case STB_ps_hash: {
         stb_ps_hash *h = GetHash(ps);
         for (i=0; i < h->count; ++i)
            if (!stb_ps_empty(h->table[i]))
               if (!func(h->table[i], data))
                  return STB_FALSE;
         return STB_TRUE;
      }
   }
   return STB_TRUE; /* NOTREACHED */
}